

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O1

Optional<llvm::DWARFFormValue> * __thiscall
llvm::DWARFDie::find
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,DWARFDie *this,Attribute Attr)

{
  DWARFAbbreviationDeclaration *this_00;
  uint64_t DIEOffset;
  
  if (((this->U != (DWARFUnit *)0x0) && (this->Die != (DWARFDebugInfoEntry *)0x0)) &&
     (this_00 = getAbbreviationDeclarationPtr(this), this_00 != (DWARFAbbreviationDeclaration *)0x0)
     ) {
    DIEOffset = getOffset(this);
    DWARFAbbreviationDeclaration::getAttributeValue
              (__return_storage_ptr__,this_00,DIEOffset,Attr,this->U);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->Storage).field_0.empty = '\0';
  (__return_storage_ptr__->Storage).hasVal = false;
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue> DWARFDie::find(dwarf::Attribute Attr) const {
  if (!isValid())
    return None;
  auto AbbrevDecl = getAbbreviationDeclarationPtr();
  if (AbbrevDecl)
    return AbbrevDecl->getAttributeValue(getOffset(), Attr, *U);
  return None;
}